

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::OutputSampleMean
          (aggreports *this,int handle,int eptype,int eptype_tvar,
          offset_in_OutLosses_to_subr GetOutLoss)

{
  int eptype_00;
  int eptype_tvar_00;
  size_type sVar1;
  int in_R9D;
  undefined1 local_58 [4];
  int epcalc;
  vector<int,_std::allocator<int>_> fileIDs;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  int eptype_tvar_local;
  int eptype_local;
  int handle_local;
  aggreports *this_local;
  
  if ((this->outputFlags_[handle] & 1U) != 0) {
    fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)GetOutLoss;
    GetFileIDs((vector<int,_std::allocator<int>_> *)local_58,this,handle,0);
    eptype_00 = (uint)(this->ordFlag_ & 1) * 4 + (uint)((this->ordFlag_ ^ 0xffU) & 1) * 2;
    eptype_tvar_00 = (uint)(this->ordFlag_ & 1) * eptype;
    sVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
            size(&this->periodstoweighting_);
    if (sVar1 == 0) {
      SampleMean(this,(vector<int,_std::allocator<int>_> *)local_58,
                 (offset_in_OutLosses_to_subr)
                 fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,in_R9D,eptype_00,eptype_tvar_00);
    }
    else {
      SampleMeanWithWeighting
                (this,(vector<int,_std::allocator<int>_> *)local_58,
                 (offset_in_OutLosses_to_subr)
                 fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,in_R9D,eptype_00,eptype_tvar_00);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  }
  return;
}

Assistant:

void aggreports::OutputSampleMean(const int handle, int eptype,
				  const int eptype_tvar,
				  OASIS_FLOAT (OutLosses::*GetOutLoss)()) {

  if (outputFlags_[handle] == false) return;

  std::vector<int> fileIDs = GetFileIDs(handle);

  // EPCalc = MEANSAMPLE for ORD output
  // EPCalc = 2 for legacy output
  int epcalc = ordFlag_ * MEANSAMPLE + !ordFlag_ * 2;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    SampleMean(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);
    return;
  }

  SampleMeanWithWeighting(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);

}